

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall
xray_re::xr_ogf_v3::motion_io::import_params
          (motion_io *this,xr_ini_file *ini,ogf3_motion_type motion_type,char *section,char *name,
          xr_ogf_v3 *ogf)

{
  char *pcVar1;
  bool bVar2;
  uint16_t uVar3;
  char *pcVar4;
  xr_partition *pxVar5;
  undefined8 uVar6;
  xr_bone *pxVar7;
  float fVar8;
  allocator<char> local_b1;
  string local_b0;
  xr_bone *local_90;
  xr_bone *bone;
  char *bone_name;
  allocator<char> local_69;
  string local_68;
  xr_partition *local_48;
  xr_partition *part;
  char *part_name;
  xr_ogf_v3 *ogf_local;
  char *name_local;
  char *section_local;
  xr_ini_file *pxStack_18;
  ogf3_motion_type motion_type_local;
  xr_ini_file *ini_local;
  motion_io *this_local;
  
  part_name = (char *)ogf;
  ogf_local = (xr_ogf_v3 *)name;
  name_local = section;
  section_local._4_4_ = motion_type;
  pxStack_18 = ini;
  ini_local = (xr_ini_file *)this;
  if (motion_type == SMT_CYCLE) {
    part = (xr_partition *)xr_ini_file::r_string(ini,section,"part");
    pcVar4 = strstr((char *)part,"--none--");
    pcVar1 = part_name;
    pxVar5 = part;
    if (pcVar4 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,(char *)pxVar5,&local_69);
      pxVar5 = xr_object::find_partition((xr_object *)pcVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
      local_48 = pxVar5;
      if (pxVar5 == (xr_partition *)0x0) {
        msg("unknown partition %s in motion %s",part,ogf_local);
        uVar6 = __cxa_allocate_exception(1);
        __cxa_throw(uVar6,&xr_error::typeinfo,0);
      }
      uVar3 = xr_partition::id(pxVar5);
      (this->super_xr_skl_motion).m_bone_or_part = uVar3;
    }
    else {
      (this->super_xr_skl_motion).m_bone_or_part = 0xffff;
    }
    (this->super_xr_skl_motion).m_flags = 0;
  }
  else {
    pxVar7 = (xr_bone *)xr_ini_file::r_string(ini,section,"bone");
    pcVar1 = part_name;
    bone = pxVar7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,(char *)pxVar7,&local_b1)
    ;
    pxVar7 = xr_object::find_bone((xr_object *)pcVar1,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    local_90 = pxVar7;
    if (pxVar7 == (xr_bone *)0x0) {
      msg("unknown bone %s in motion %s",bone,ogf_local);
      uVar6 = __cxa_allocate_exception(1);
      __cxa_throw(uVar6,&xr_error::typeinfo,0);
    }
    uVar3 = xr_bone::id(pxVar7);
    (this->super_xr_skl_motion).m_bone_or_part = uVar3;
    (this->super_xr_skl_motion).m_flags = 1;
  }
  fVar8 = xr_ini_file::r_float(pxStack_18,name_local,"speed");
  (this->super_xr_skl_motion).m_speed = fVar8;
  fVar8 = xr_ini_file::r_float(pxStack_18,name_local,"power");
  (this->super_xr_skl_motion).m_power = fVar8;
  fVar8 = xr_ini_file::r_float(pxStack_18,name_local,"accrue");
  (this->super_xr_skl_motion).m_accrue = fVar8;
  fVar8 = xr_ini_file::r_float(pxStack_18,name_local,"falloff");
  (this->super_xr_skl_motion).m_falloff = fVar8;
  bVar2 = xr_ini_file::r_bool(pxStack_18,name_local,"stop@end");
  if (bVar2) {
    (this->super_xr_skl_motion).m_flags = (this->super_xr_skl_motion).m_flags | 2;
  }
  std::__cxx11::string::operator=
            ((string *)&(this->super_xr_skl_motion).super_xr_motion.m_name,(char *)ogf_local);
  return;
}

Assistant:

inline void xr_ogf_v3::motion_io::import_params(const xr_ini_file& ini, ogf3_motion_type motion_type,
		const char* section, const char* name, xr_ogf_v3& ogf)
{
	if (motion_type == SMT_CYCLE) {
		const char* part_name = ini.r_string(section, "part");
		if (strstr(part_name, "--none--") == 0) {
			xr_partition* part = ogf.find_partition(part_name);
			if (part == 0) {
				msg("unknown partition %s in motion %s", part_name, name);
				throw xr_error();
			}
			m_bone_or_part = part->id();
		} else {
			m_bone_or_part = ALL_PARTITIONS;
		}
		m_flags = 0;
	} else {
		const char* bone_name = ini.r_string(section, "bone");
		xr_bone* bone = ogf.find_bone(bone_name);
		if (bone == 0) {
			msg("unknown bone %s in motion %s", bone_name, name);
			throw xr_error();
		}
		m_bone_or_part = bone->id();
		m_flags = SMF_FX;
	}
	m_speed = ini.r_float(section, "speed");
	m_power = ini.r_float(section, "power");
	m_accrue = ini.r_float(section, "accrue");
	m_falloff = ini.r_float(section, "falloff");
	if (ini.r_bool(section, "stop@end"))
		m_flags |= SMF_STOP_AT_END;
//	else
//		m_flags &= ~SMF_STOP_AT_END;
	m_name = name;
}